

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControl::canInsertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  char cVar1;
  char cVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = *(char *)(*(long *)(this + 8) + 0x111);
  cVar1 = QMimeData::hasText();
  if (cVar2 == '\x01') {
    if (cVar1 != '\0') {
      QMimeData::text();
      uVar3 = 1;
      if (local_40.size != 0) goto LAB_00482d4c;
    }
    cVar2 = QMimeData::hasHtml();
    if (cVar2 == '\0') {
      latin1.m_data = "application/x-qrichtext";
      latin1.m_size = 0x17;
      QString::QString((QString *)&local_58,latin1);
      cVar2 = (**(code **)(*(long *)source + 0x60))(source,&local_58);
      uVar3 = 1;
      if (cVar2 == '\0') {
        latin1_00.m_data = "application/x-qt-richtext";
        latin1_00.m_size = 0x19;
        QString::QString((QString *)&local_70,latin1_00);
        uVar3 = (**(code **)(*(long *)source + 0x60))(source,&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      uVar3 = 1;
    }
    if (cVar1 == '\0') goto LAB_00482d51;
  }
  else {
    if (cVar1 == '\0') {
      uVar3 = 0;
      goto LAB_00482d51;
    }
    QMimeData::text();
    uVar3 = local_40.size != 0;
  }
LAB_00482d4c:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
LAB_00482d51:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QWidgetTextControl::canInsertFromMimeData(const QMimeData *source) const
{
    Q_D(const QWidgetTextControl);
    if (d->acceptRichText)
        return (source->hasText() && !source->text().isEmpty())
            || source->hasHtml()
            || source->hasFormat("application/x-qrichtext"_L1)
            || source->hasFormat("application/x-qt-richtext"_L1);
    else
        return source->hasText() && !source->text().isEmpty();
}